

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O2

void __thiscall
FastPForLib::FastPForTest_fastpack_3_except_64_Test::FastPForTest_fastpack_3_except_64_Test
          (FastPForTest_fastpack_3_except_64_Test *this)

{
  FastPForTest::FastPForTest(&this->super_FastPForTest);
  (this->super_FastPForTest).
  super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__FastPForTest_001a6428;
  (this->super_FastPForTest).
  super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_WithParamInterface = (_func_int **)&PTR__FastPForTest_fastpack_3_except_64_Test_001a6468;
  return;
}

Assistant:

TEST_P(FastPForTest, fastpack_3_except_64) {
    _genDataWithFixBits64(in64, 3, 256);
    for (int i = 20; i < 40; ++i) {
      in64[i] = ~0UL - i;
    }
    for (int i = 155; i < 195; i += 2) {
      in64[i] = ~0UL - i ;
    }
    _verify64();
  }